

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_huffman_block(stbi__zbuf *a)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  stbi__zbuf *psVar5;
  stbi__zbuf *psVar6;
  long in_RDI;
  stbi_uc v;
  int dist;
  int len;
  stbi_uc *p;
  int z;
  char *zout;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  stbi__zbuf *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  stbi__zbuf *z_00;
  
  z_00 = *(stbi__zbuf **)(in_RDI + 0x18);
  while( true ) {
    while (iVar2 = stbi__zhuffman_decode
                             (in_stack_ffffffffffffffd8,
                              (stbi__zhuffman *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
          iVar2 < 0x100) {
      if (iVar2 < 0) {
        iVar2 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        return iVar2;
      }
      if (*(stbi__zbuf **)(in_RDI + 0x28) <= z_00) {
        iVar3 = stbi__zexpand(z_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                              (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
        if (iVar3 == 0) {
          return 0;
        }
        z_00 = *(stbi__zbuf **)(in_RDI + 0x18);
      }
      *(char *)&z_00->zbuffer = (char)iVar2;
      z_00 = (stbi__zbuf *)((long)&z_00->zbuffer + 1);
    }
    if (iVar2 == 0x100) {
      *(stbi__zbuf **)(in_RDI + 0x18) = z_00;
      return 1;
    }
    in_stack_ffffffffffffffd4 = stbi__zlength_base[iVar2 + -0x101];
    if (stbi__zlength_extra[iVar2 + -0x101] != 0) {
      uVar4 = stbi__zreceive((stbi__zbuf *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd4 = uVar4 + in_stack_ffffffffffffffd4;
    }
    iVar2 = stbi__zhuffman_decode
                      (in_stack_ffffffffffffffd8,
                       (stbi__zhuffman *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
    if (iVar2 < 0) break;
    in_stack_ffffffffffffffd0 = stbi__zdist_base[iVar2];
    if (stbi__zdist_extra[iVar2] != 0) {
      uVar4 = stbi__zreceive((stbi__zbuf *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
      in_stack_ffffffffffffffd0 = uVar4 + in_stack_ffffffffffffffd0;
    }
    if ((long)z_00 - *(long *)(in_RDI + 0x20) < (long)in_stack_ffffffffffffffd0) {
      iVar2 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      return iVar2;
    }
    if (*(ulong *)(in_RDI + 0x28) <
        (ulong)((long)(z_00->z_length).fast + (long)in_stack_ffffffffffffffd4 + -0x34)) {
      iVar2 = stbi__zexpand(z_00,(char *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),iVar3);
      if (iVar2 == 0) {
        return 0;
      }
      z_00 = *(stbi__zbuf **)(in_RDI + 0x18);
    }
    in_stack_ffffffffffffffd8 = (stbi__zbuf *)((long)z_00 - (long)in_stack_ffffffffffffffd0);
    if (in_stack_ffffffffffffffd0 == 1) {
      uVar1 = *(undefined1 *)&in_stack_ffffffffffffffd8->zbuffer;
      in_stack_ffffffffffffffcc = CONCAT13(uVar1,(int3)in_stack_ffffffffffffffcc);
      if (in_stack_ffffffffffffffd4 != 0) {
        do {
          psVar5 = (stbi__zbuf *)((long)&z_00->zbuffer + 1);
          *(undefined1 *)&z_00->zbuffer = uVar1;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + -1;
          z_00 = psVar5;
        } while (in_stack_ffffffffffffffd4 != 0);
        in_stack_ffffffffffffffd4 = 0;
      }
    }
    else if (in_stack_ffffffffffffffd4 != 0) {
      do {
        psVar5 = (stbi__zbuf *)((long)&in_stack_ffffffffffffffd8->zbuffer + 1);
        psVar6 = (stbi__zbuf *)((long)&z_00->zbuffer + 1);
        *(undefined1 *)&z_00->zbuffer = *(undefined1 *)&in_stack_ffffffffffffffd8->zbuffer;
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + -1;
        in_stack_ffffffffffffffd8 = psVar5;
        z_00 = psVar6;
      } while (in_stack_ffffffffffffffd4 != 0);
      in_stack_ffffffffffffffd4 = 0;
    }
  }
  iVar2 = stbi__err((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return iVar2;
}

Assistant:

static int stbi__parse_huffman_block(stbi__zbuf *a)
{
   char *zout = a->zout;
   for(;;) {
      int z = stbi__zhuffman_decode(a, &a->z_length);
      if (z < 256) {
         if (z < 0) return stbi__err("bad huffman code","Corrupt PNG"); // error in huffman codes
         if (zout >= a->zout_end) {
            if (!stbi__zexpand(a, zout, 1)) return 0;
            zout = a->zout;
         }
         *zout++ = (char) z;
      } else {
         stbi_uc *p;
         int len,dist;
         if (z == 256) {
            a->zout = zout;
            return 1;
         }
         z -= 257;
         len = stbi__zlength_base[z];
         if (stbi__zlength_extra[z]) len += stbi__zreceive(a, stbi__zlength_extra[z]);
         z = stbi__zhuffman_decode(a, &a->z_distance);
         if (z < 0) return stbi__err("bad huffman code","Corrupt PNG");
         dist = stbi__zdist_base[z];
         if (stbi__zdist_extra[z]) dist += stbi__zreceive(a, stbi__zdist_extra[z]);
         if (zout - a->zout_start < dist) return stbi__err("bad dist","Corrupt PNG");
         if (zout + len > a->zout_end) {
            if (!stbi__zexpand(a, zout, len)) return 0;
            zout = a->zout;
         }
         p = (stbi_uc *) (zout - dist);
         if (dist == 1) { // run of one byte; common in images.
            stbi_uc v = *p;
            if (len) { do *zout++ = v; while (--len); }
         } else {
            if (len) { do *zout++ = *p++; while (--len); }
         }
      }
   }
}